

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

bool isMacMechanism(CK_MECHANISM_PTR pMechanism)

{
  CK_MECHANISM_TYPE CVar1;
  CK_MECHANISM_PTR pMechanism_local;
  bool local_1;
  
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    local_1 = false;
  }
  else {
    CVar1 = pMechanism->mechanism;
    if (((((CVar1 == 0x138) || (CVar1 == 0x211)) || (CVar1 == 0x221)) ||
        ((CVar1 == 0x251 || (CVar1 == 0x256)))) ||
       ((CVar1 == 0x261 || ((CVar1 == 0x271 || (CVar1 == 0x108a)))))) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool isMacMechanism(CK_MECHANISM_PTR pMechanism)
{
	if (pMechanism == NULL_PTR) return false;

	switch(pMechanism->mechanism) {
		case CKM_MD5_HMAC:
		case CKM_SHA_1_HMAC:
		case CKM_SHA224_HMAC:
		case CKM_SHA256_HMAC:
		case CKM_SHA384_HMAC:
		case CKM_SHA512_HMAC:
#ifdef WITH_GOST
		case CKM_GOSTR3411_HMAC:
#endif
		case CKM_DES3_CMAC:
		case CKM_AES_CMAC:
			return true;
		default:
			return false;
	}
}